

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O0

void HBLAS2::hblas2_ger_square<double,false>(void)

{
  bool bVar1;
  reference pvVar2;
  reference __y;
  lazy_ostream *prev;
  quaternion<double> *A_00;
  int i;
  int j;
  stringstream ss;
  double ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> AC;
  quaternion<double> *x_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_2;
  quaternion<double> *x_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_1;
  quaternion<double> *x;
  iterator __end2;
  iterator __begin2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_fffffffffffffab8;
  undefined1 pv_;
  undefined4 in_stack_fffffffffffffac0;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffac4;
  undefined8 in_stack_fffffffffffffac8;
  int32_t INCY;
  quaternion<double> *in_stack_fffffffffffffad0;
  size_type in_stack_fffffffffffffad8;
  int32_t INCX;
  undefined8 uVar4;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffffae0;
  quaternion<double> *X_00;
  quaternion<double> *ALPHA_00;
  int32_t LDA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffffb08;
  quaternion<double> *in_stack_fffffffffffffb10;
  quaternion<double> *in_stack_fffffffffffffb50;
  quaternion<double> *in_stack_fffffffffffffb58;
  basic_cstring<const_char> local_480;
  basic_cstring<const_char> local_470;
  undefined1 local_460 [32];
  undefined8 local_440;
  undefined1 local_378 [24];
  undefined1 local_360 [16];
  basic_cstring<const_char> local_350;
  int local_340;
  int local_33c;
  stringstream local_338 [16];
  ostream local_328 [376];
  quaternion<double> *local_1b0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_1a8;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_190;
  quaternion<double> *local_188;
  result_type_conflict1 local_180;
  result_type_conflict1 local_178;
  quaternion<double> local_170;
  reference local_150;
  quaternion<double> *local_148;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_140;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_138;
  result_type_conflict1 local_130;
  result_type_conflict1 local_128;
  result_type_conflict1 local_120;
  result_type_conflict1 local_118;
  quaternion<double> local_110;
  reference local_f0;
  quaternion<double> *local_e8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_e0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_d8;
  result_type_conflict1 local_d0;
  quaternion<double> *local_c8;
  quaternion<double> *local_c0;
  result_type_conflict1 local_b8;
  quaternion<double> local_b0;
  reference local_90;
  quaternion<double> *local_88;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_80;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_78;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_68;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_48 [2];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_18;
  
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1f716c);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
             (allocator_type *)in_stack_fffffffffffffad0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1f7195);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1f71aa);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
             (allocator_type *)in_stack_fffffffffffffad0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1f71d3);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1f71e8);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
             (allocator_type *)in_stack_fffffffffffffad0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x1f7211);
  local_78 = &local_18;
  local_80._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffffab8);
  local_88 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         *)in_stack_fffffffffffffab8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                            (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                             *)in_stack_fffffffffffffab8), bVar1) {
    local_90 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_80);
    local_b8 = std::uniform_real_distribution<double>::operator()
                         ((uniform_real_distribution<double> *)
                          CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                          in_stack_fffffffffffffab8);
    in_stack_fffffffffffffb58 =
         (quaternion<double> *)
         std::uniform_real_distribution<double>::operator()
                   ((uniform_real_distribution<double> *)
                    CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                    in_stack_fffffffffffffab8);
    local_c0 = in_stack_fffffffffffffb58;
    in_stack_fffffffffffffb50 =
         (quaternion<double> *)
         std::uniform_real_distribution<double>::operator()
                   ((uniform_real_distribution<double> *)
                    CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                    in_stack_fffffffffffffab8);
    local_c8 = in_stack_fffffffffffffb50;
    local_d0 = std::uniform_real_distribution<double>::operator()
                         ((uniform_real_distribution<double> *)
                          CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                          in_stack_fffffffffffffab8);
    HAXX::quaternion<double>::quaternion
              (&local_b0,&local_b8,(double *)&local_c0,(double *)&local_c8,&local_d0);
    local_90->_M_real = local_b0._M_real;
    local_90->_M_imag_i = local_b0._M_imag_i;
    local_90->_M_imag_j = local_b0._M_imag_j;
    local_90->_M_imag_k = local_b0._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_80);
  }
  local_d8 = local_48;
  local_e0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffffab8);
  local_e8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                         *)in_stack_fffffffffffffab8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                            (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                             *)in_stack_fffffffffffffab8), bVar1) {
    local_f0 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_e0);
    local_118 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)
                           CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                           in_stack_fffffffffffffab8);
    local_120 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)
                           CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                           in_stack_fffffffffffffab8);
    local_128 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)
                           CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                           in_stack_fffffffffffffab8);
    local_130 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)
                           CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                           in_stack_fffffffffffffab8);
    HAXX::quaternion<double>::quaternion(&local_110,&local_118,&local_120,&local_128,&local_130);
    local_f0->_M_real = local_110._M_real;
    local_f0->_M_imag_i = local_110._M_imag_i;
    local_f0->_M_imag_j = local_110._M_imag_j;
    local_f0->_M_imag_k = local_110._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_e0);
  }
  local_138 = &local_68;
  local_140._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
                  in_stack_fffffffffffffab8);
  local_148 = (quaternion<double> *)
              std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                        ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                          *)in_stack_fffffffffffffab8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffffab8);
    INCX = (int32_t)(in_stack_fffffffffffffad8 >> 0x20);
    INCY = (int32_t)((ulong)in_stack_fffffffffffffac8 >> 0x20);
    if (!bVar1) break;
    local_150 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_140);
    local_178 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)
                           CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                           in_stack_fffffffffffffab8);
    local_180 = std::uniform_real_distribution<double>::operator()
                          ((uniform_real_distribution<double> *)
                           CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                           in_stack_fffffffffffffab8);
    in_stack_fffffffffffffb10 =
         (quaternion<double> *)
         std::uniform_real_distribution<double>::operator()
                   ((uniform_real_distribution<double> *)
                    CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                    in_stack_fffffffffffffab8);
    local_188 = in_stack_fffffffffffffb10;
    in_stack_fffffffffffffb08 =
         (vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
         std::uniform_real_distribution<double>::operator()
                   ((uniform_real_distribution<double> *)
                    CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
                    in_stack_fffffffffffffab8);
    local_190 = in_stack_fffffffffffffb08;
    HAXX::quaternion<double>::quaternion
              (&local_170,&local_178,&local_180,(double *)&local_188,(double *)&local_190);
    local_150->_M_real = local_170._M_real;
    local_150->_M_imag_i = local_170._M_imag_i;
    local_150->_M_imag_j = local_170._M_imag_j;
    local_150->_M_imag_k = local_170._M_imag_k;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_140);
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
  LDA = (int32_t)in_stack_fffffffffffffb08;
  A_00 = (quaternion<double> *)genRandom<double>();
  local_1b0 = A_00;
  std::__cxx11::stringstream::stringstream(local_338);
  std::operator<<(local_328,"hblas2_ger ");
  std::operator<<(local_328,"u");
  std::operator<<(local_328,"_square_");
  std::operator<<(local_328,"R");
  X_00 = (quaternion<double> *)0x0;
  ALPHA_00 = local_1b0;
  pvVar2 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](&local_18,0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
            (local_48,(size_type)X_00);
  __y = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
        operator[](&local_68,(size_type)X_00);
  uVar3 = 100;
  HAXX::HBLAS_GERU<double,HAXX::quaternion<double>,HAXX::quaternion<double>,double>
            ((int32_t)((ulong)pvVar2 >> 0x20),(int32_t)pvVar2,(double)ALPHA_00,X_00,INCX,
             in_stack_fffffffffffffad0,INCY,A_00,LDA);
  for (local_33c = 0; local_33c < 100; local_33c = local_33c + 1) {
    for (local_340 = 0; local_340 < 100; local_340 = local_340 + 1) {
      do {
        uVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_350,
                   "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx"
                   ,0x58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)CONCAT44(in_stack_fffffffffffffac4,uVar3));
        boost::unit_test::unit_test_log_t::set_checkpoint(uVar4,&local_350,0xfc,local_360);
        std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
        operator[](&local_18,(long)local_340);
        HAXX::operator*((double *)CONCAT44(in_stack_fffffffffffffac4,uVar3),__y);
        std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
        operator[](local_48,(long)local_33c);
        HAXX::operator*(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
        std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
        operator[](&local_1a8,(long)(local_340 + local_33c * 100));
        HAXX::operator+((quaternion<double> *)CONCAT44(in_stack_fffffffffffffac4,uVar3),__y);
        std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
        operator[](&local_68,(long)(local_340 + local_33c * 100));
        HAXX::inv<double>(in_stack_fffffffffffffb10);
        HAXX::operator*(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
        local_440 = 0x3ff0000000000000;
        HAXX::operator-((quaternion<double> *)CONCAT44(in_stack_fffffffffffffac4,uVar3),
                        &__y->_M_real);
        pv_ = (undefined1)((ulong)__y >> 0x38);
        in_stack_fffffffffffffad0 = (quaternion<double> *)HAXX::norm<double>(X_00);
        boost::test_tools::assertion_result::assertion_result
                  ((assertion_result *)CONCAT44(in_stack_fffffffffffffac4,uVar3),(bool)pv_);
        prev = boost::unit_test::lazy_ostream::instance();
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_470,
                   "( HAXX::norm(((ALPHA*X[i]*Y[j] + AC[( (i) + (j)*(100) )]) * HAXX::inv(A[( (i) + (j)*(100) )]))- 1.) < 1e-12 )"
                   ,0x6d);
        boost::unit_test::operator<<
                  (prev,(basic_cstring<const_char> *)CONCAT44(in_stack_fffffffffffffac4,uVar3));
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_480,
                   "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx"
                   ,0x58);
        __y = (reference)0x0;
        boost::test_tools::tt_detail::report_assertion(local_378,local_460,&local_480,0xfc,1,0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                    *)0x1f7b15);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x1f7b22);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
  }
  std::__cxx11::stringstream::~stringstream(local_338);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffffad0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffffad0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffffad0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffffad0);
  return;
}

Assistant:

void hblas2_ger_square() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN), A(HBLAS2_MATLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y)
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> AC(A);

  _AlphaF ALPHA = genRandom<_AlphaF>();

  std::stringstream ss;

  ss << "hblas2_ger ";
  if( _CONJ ) ss << "c";
  else        ss << "u";
  ss << "_square_";
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";

  if( _CONJ )
    HBLAS_GERC(HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&X[0],1,&Y[0],1,&A[0],HBLAS1_VECLEN);
  else
    HBLAS_GERU(HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&X[0],1,&Y[0],1,&A[0],HBLAS1_VECLEN);

  for(int j = 0; j < HBLAS1_VECLEN; j++) 
  for(int i = 0; i < HBLAS1_VECLEN; i++) {

    if( _CONJ )
      BOOST_CHECK(
        CMP_Q(
          ALPHA*X[i]*HAXX::conj(Y[j]) + AC[RANK2_INDX(i,j,HBLAS1_VECLEN)],
          A[RANK2_INDX(i,j,HBLAS1_VECLEN)]
        )
      );
    else
      BOOST_CHECK(
        CMP_Q(
          ALPHA*X[i]*Y[j] + AC[RANK2_INDX(i,j,HBLAS1_VECLEN)],
          A[RANK2_INDX(i,j,HBLAS1_VECLEN)]
        )
      );

  }
}